

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O2

Gia_Man_t *
Bmc_GiaGenerateGiaOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  int iVar1;
  int iVar2;
  uint iLit1;
  Vec_Bit_t *pVVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  char *pcVar5;
  int Entry;
  int iVar6;
  int local_64;
  Vec_Bit_t *vJustis;
  Vec_Bit_t *vValues;
  
  Bmc_GiaGenerateJust(p,pCex,&vValues,&vJustis);
  pVVar3 = Vec_BitStart(p->nRegs);
  *pvInits = pVVar3;
  for (iVar6 = 0; iVar2 = p->nRegs, iVar6 < iVar2; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - iVar2) + iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      break;
    }
    iVar2 = p->nObjs;
    iVar1 = Gia_ObjId(p,pGVar4);
    iVar2 = Vec_BitEntry(vValues,iVar2 * iFrBeg + iVar1);
    if (iVar2 != 0) {
      Vec_BitWriteEntry(*pvInits,iVar6,Entry);
    }
  }
  p_00 = Gia_ManStart(iVar2 * 2 + 2);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar5;
  local_64 = 1;
  for (iVar6 = 0; iVar6 < p->nRegs; iVar6 = iVar6 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar6);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iLit1 = Gia_ManAppendCi(p_00);
    iVar2 = p->nObjs;
    iVar1 = Gia_ObjId(p,pGVar4);
    iVar2 = Vec_BitEntry(vJustis,iVar2 * iFrEnd + iVar1);
    if (iVar2 != 0) {
      iVar2 = p->nObjs;
      iVar1 = Gia_ObjId(p,pGVar4);
      iVar2 = Vec_BitEntry(vValues,iVar2 * iFrEnd + iVar1);
      if (iVar2 == 0) {
        if ((int)iLit1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10e,"int Abc_LitNot(int)");
        }
        iLit1 = iLit1 ^ 1;
      }
      local_64 = Gia_ManAppendAnd(p_00,local_64,iLit1);
    }
  }
  Gia_ManAppendCo(p_00,local_64);
  Vec_BitFree(vValues);
  Vec_BitFree(vJustis);
  return p_00;
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Vec_Bit_t * vValues;
    Vec_Bit_t * vJustis;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int k, Cube = 1, Counter = 0;
    Bmc_GiaGenerateJust( p, pCex, &vValues, &vJustis );
    // collect flop values in frame iFrBeg
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, k )
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrBeg + Gia_ObjId(p, pObj)) )
            Vec_BitWriteEntry( *pvInits, k, 1 );
    // create GIA with justified values in iFrEnd
    pNew = Gia_ManStart( 2 * Gia_ManRegNum(p) + 2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManForEachRo( p, pObj, k )
    {
        int Literal = Gia_ManAppendCi(pNew);
        if ( !Vec_BitEntry(vJustis, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            continue;
        if ( Vec_BitEntry(vValues, Gia_ManObjNum(p) * iFrEnd + Gia_ObjId(p, pObj)) )
            Cube = Gia_ManAppendAnd( pNew, Cube, Literal );
        else
            Cube = Gia_ManAppendAnd( pNew, Cube, Abc_LitNot(Literal) );
        Counter++;
    }
//    printf( "Only %d flops (out of %d) belong to the care set.\n", Counter, Gia_ManRegNum(p) );
    Gia_ManAppendCo( pNew, Cube );
    Vec_BitFree( vValues );
    Vec_BitFree( vJustis );
    return pNew;
}